

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation_p.cpp
# Opt level: O2

void QUnifiedTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    if (_id == 1) {
      stopTimer((QUnifiedTimer *)_o);
      return;
    }
    if (_id == 0) {
      startTimers((QUnifiedTimer *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QUnifiedTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUnifiedTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->startTimers(); break;
        case 1: _t->stopTimer(); break;
        default: ;
        }
    }
    (void)_a;
}